

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fexdo_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  float64 fVar5;
  bool bVar6;
  float16 fVar7;
  float32 fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  long lVar17;
  float_status *status_2;
  ulong uVar18;
  uint32_t unaff_retaddr;
  float_status *status;
  wr_t wx;
  undefined8 local_58;
  float64 fStack_50;
  uint32_t local_44;
  fpr_t *local_40;
  fpr_t *local_38;
  
  local_38 = (env->active_fpu).fpr + ws;
  local_40 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_44 = wd;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar17 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = local_38->fs[lVar17];
      fVar7 = float32_to_float16_mips64(fVar8,true,pfVar2);
      *(ushort *)((long)&fStack_50 + lVar17 * 2) = (ushort)(fVar8 >> 0x10) & 0x8000 | fVar7;
      bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = ieee_ex_to_mips_mips64((uint)bVar4);
      uVar11 = (env->active_tc).msacsr;
      uVar9 = (uVar11 & 0x1000000) >> 0x18 & (uint)(bVar4 >> 6);
      uVar15 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar15 = uVar9;
      }
      if (-1 < (char)bVar4) {
        uVar15 = uVar9;
      }
      uVar15 = uVar15 | uVar13;
      uVar9 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar13 >> 2);
      uVar14 = uVar9 | uVar15;
      uVar13 = uVar13 & 0xfffffffc;
      if ((uVar9 != 0 || (uVar15 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar13 = uVar14;
      }
      if ((uVar15 & 2) == 0) {
        uVar13 = uVar14;
      }
      if ((uVar13 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar13 << 0xc;
LAB_008bcae3:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar13) != 0) goto LAB_008bcafe;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar15 = uVar13 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_008bcae3;
        }
LAB_008bcafe:
        fVar7 = float16_default_nan_mips64(pfVar2);
        *(float16 *)((long)&fStack_50 + lVar17 * 2) = fVar7 & 0xffc0 ^ 0x200 | (ushort)uVar13;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = local_40->fs[lVar17];
      fVar7 = float32_to_float16_mips64(fVar8,true,pfVar2);
      *(ushort *)((long)&local_58 + lVar17 * 2) = (ushort)(fVar8 >> 0x10) & 0x8000 | fVar7;
      bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = ieee_ex_to_mips_mips64((uint)bVar4);
      uVar11 = (env->active_tc).msacsr;
      uVar9 = (uVar11 & 0x1000000) >> 0x18 & (uint)(bVar4 >> 6);
      uVar15 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar15 = uVar9;
      }
      if (-1 < (char)bVar4) {
        uVar15 = uVar9;
      }
      uVar15 = uVar15 | uVar13;
      uVar14 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar13 >> 2);
      uVar9 = uVar14 | uVar15;
      uVar13 = uVar13 & 0xfffffffc;
      if ((uVar14 != 0 || (uVar15 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar13 = uVar9;
      }
      if ((uVar15 & 2) == 0) {
        uVar13 = uVar9;
      }
      if ((uVar13 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar13 << 0xc;
LAB_008bcbf2:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar13) != 0) goto LAB_008bcc0d;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar15 = uVar13 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_008bcbf2;
        }
LAB_008bcc0d:
        fVar7 = float16_default_nan_mips64(pfVar2);
        *(float16 *)((long)&local_58 + lVar17 * 2) = fVar7 & 0xffc0 ^ 0x200 | (ushort)uVar13;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x19bc,
                    "void helper_msa_fexdo_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    puVar12 = (uint *)&local_58;
    uVar18 = 0;
    bVar6 = true;
    do {
      bVar16 = bVar6;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = *(float64 *)((long)local_38 + uVar18 * 8);
      fVar8 = float64_to_float32_mips64(fVar5,pfVar2);
      uVar11 = fVar8 | 0x80000000;
      if (-1 < (long)fVar5) {
        uVar11 = fVar8;
      }
      *(uint *)((long)&fStack_50 + uVar18 * 4) = uVar11;
      if ((uVar11 & 0x7fffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar4;
        if ((uVar11 & 0x7f800000) == 0) {
          uVar15 = bVar4 | 0x10;
        }
      }
      uVar9 = ieee_ex_to_mips_mips64(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar13 = uVar14;
      }
      uVar13 = uVar13 | uVar9;
      uVar10 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar9 >> 2);
      uVar14 = uVar10 | uVar13;
      uVar15 = uVar9 & 0xfffffffc;
      if ((uVar10 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar14;
      }
      if ((uVar13 & 2) == 0) {
        uVar15 = uVar14;
      }
      if ((uVar15 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar15 << 0xc;
LAB_008bc878:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_008bc893;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar13 = uVar15 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_008bc878;
        }
LAB_008bc893:
        fVar8 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)&local_58 + (uVar18 | 2) * 4) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar15;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = *(float64 *)((long)local_40 + uVar18 * 8);
      fVar8 = float64_to_float32_mips64(fVar5,pfVar2);
      uVar11 = fVar8 | 0x80000000;
      if (-1 < (long)fVar5) {
        uVar11 = fVar8;
      }
      *puVar12 = uVar11;
      if ((uVar11 & 0x7fffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar4;
        if ((uVar11 & 0x7f800000) == 0) {
          uVar15 = bVar4 | 0x10;
        }
      }
      uVar9 = ieee_ex_to_mips_mips64(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar13 = uVar14;
      }
      uVar13 = uVar13 | uVar9;
      uVar14 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar9 >> 2);
      uVar10 = uVar14 | uVar13;
      uVar15 = uVar9 & 0xfffffffc;
      if ((uVar14 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar10;
      }
      if ((uVar13 & 2) == 0) {
        uVar15 = uVar10;
      }
      if ((uVar15 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar15 << 0xc;
LAB_008bc9ab:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_008bc9c6;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar13 = uVar15 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_008bc9ab;
        }
LAB_008bc9c6:
        fVar8 = float32_default_nan_mips64(pfVar2);
        *puVar12 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar15;
      }
      uVar18 = 1;
      puVar12 = (uint *)((long)&local_58 + 4);
      bVar6 = false;
    } while (bVar16);
  }
  uVar11 = (env->active_tc).msacsr;
  uVar15 = uVar11 >> 7 & 0x1f | 0x20;
  if ((uVar15 & uVar11 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar15);
  }
  (env->active_tc).msacsr = (uVar11 >> 0xc & 0x1f) << 2 | uVar11;
  pfVar3 = (env->active_fpu).fpr + local_44;
  pfVar3->fd = local_58;
  (&pfVar3->fd)[1] = fStack_50;
  return;
}

Assistant:

void helper_msa_fexdo_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                         uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(Lh(pwx, i), from_float32, pws->w[i], ieee, 16);
            MSA_FLOAT_BINOP(Rh(pwx, i), from_float32, pwt->w[i], ieee, 16);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(Lw(pwx, i), from_float64, pws->d[i], 32);
            MSA_FLOAT_UNOP(Rw(pwx, i), from_float64, pwt->d[i], 32);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}